

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

void gpu_free_renderer_memory(GPU_Renderer *renderer)

{
  GPU_RendererEnum GVar1;
  long lVar2;
  
  if (renderer != (GPU_Renderer *)0x0) {
    for (lVar2 = 0x20; lVar2 != 0x1b0; lVar2 = lVar2 + 0x28) {
      GVar1 = *(GPU_RendererEnum *)((long)_gpu_renderer_map + lVar2 + 0x88);
      if ((GVar1 != 0) && ((renderer->id).renderer == GVar1)) {
        (**(code **)((long)&_gpu_renderer_register[0].id.name + lVar2))();
        return;
      }
    }
  }
  return;
}

Assistant:

void gpu_free_renderer_memory(GPU_Renderer* renderer)
{
	int i;
	if(renderer == NULL)
        return;
	
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer == GPU_RENDERER_UNKNOWN)
			continue;
		
		if(renderer->id.renderer == _gpu_renderer_register[i].id.renderer)
		{
			_gpu_renderer_register[i].freeFn(renderer);
			return;
		}
	}
}